

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lt.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint8_t *memory;
  char **in_RSI;
  int in_EDI;
  int c_1;
  int r;
  m256v M;
  uint8_t *m;
  parameters P;
  int c;
  uint32_t *ISIs;
  int n_max_ISIs;
  int n_ISIs;
  int K;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint uVar3;
  uint uVar4;
  int local_78;
  int local_74;
  uint32_t *in_stack_ffffffffffffff98;
  uint32_t **in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc4;
  int local_4;
  
  malloc(0x80);
  while (iVar2 = getopt(in_EDI,in_RSI,"hK:i:"), iVar2 != -1) {
    if (iVar2 == 0x3f) {
      exit(1);
    }
    if (iVar2 == 0x4b) {
      atoi(_optarg);
      in_stack_ffffffffffffff7c = iVar2;
    }
    else if (iVar2 == 0x68) {
      usage();
      in_stack_ffffffffffffff7c = iVar2;
    }
    else {
      in_stack_ffffffffffffff7c = iVar2;
      if (iVar2 == 0x69) {
        parse_esis((int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff7c = iVar2;
      }
    }
  }
  parameters_get(in_stack_ffffffffffffffc4);
  if (in_stack_ffffffffffffffa8 == -1) {
    fprintf(_stderr,"Error:  Invalid choice of K.\n");
    local_4 = 1;
  }
  else {
    memory = (uint8_t *)malloc(0);
    m256v_make((m256v *)&local_78,0,in_stack_ffffffffffffffb4,memory);
    lt_generate_mat((m256v *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (parameters *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (int)((ulong)memory >> 0x20),in_stack_ffffffffffffff98);
    for (uVar4 = 0; (int)uVar4 < local_78; uVar4 = uVar4 + 1) {
      for (uVar3 = 0; (int)uVar3 < local_74; uVar3 = uVar3 + 1) {
        bVar1 = m256v_get_el((m256v *)CONCAT44(uVar4,uVar3),in_stack_ffffffffffffff7c,
                             in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff78 = (uint)bVar1;
        if (bVar1 == 0) {
          fputc(0x30,_stdout);
        }
        else {
          if (in_stack_ffffffffffffff78 != 1) {
            fprintf(_stderr,"Error: Non-binary matrix entry seen, row=%d, col=%d\n",(ulong)uVar4,
                    (ulong)uVar3);
            return 1;
          }
          fputc(0x31,_stdout);
        }
      }
      fputc(10,_stdout);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
	int K = 60;
	int n_ISIs = 0;
	int n_max_ISIs = 32;
	uint32_t* ISIs = malloc(n_max_ISIs * sizeof(uint32_t));

	/* Read command line arguments */
	int c;
	while ((c = getopt(argc, argv, "hK:i:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			break;
		case 'K':
			K = atoi(optarg);
			break;
		case 'i': {
			parse_esis(&n_ISIs, &n_max_ISIs, &ISIs, optarg);
			break;
		}
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Get parameters */
	parameters P = parameters_get(K);
	if (P.K == -1) {
		fprintf(stderr, "Error:  Invalid choice of K.\n");
		return 1;
	}

	/* Generate a suitable LT matrix */
	uint8_t* m = malloc(n_ISIs * P.L * sizeof(uint8_t));
	m256v M = m256v_make(n_ISIs, P.L, m);
	lt_generate_mat(&M, &P, n_ISIs, ISIs);

	/* Print on screen */
	for (int r = 0; r < M.n_row; ++r) {
		for (int c = 0; c < M.n_col; ++c) {
			switch (m256v_get_el(&M, r, c)) {
			case 0:		fputc('0', stdout);	break;
			case 1:		fputc('1', stdout);	break;
			default:
				fprintf(stderr, "Error: Non-binary matrix "
				  "entry seen, row=%d, col=%d\n", r, c);
				return 1;
			}
		}
		fputc('\n', stdout);
	}

	return 0;
}